

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall icu_63::CollationRuleParser::skipComment(CollationRuleParser *this,int32_t i)

{
  short sVar1;
  UnicodeString *pUVar2;
  long lVar3;
  uint uVar4;
  char16_t cVar5;
  char16_t *pcVar6;
  
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  lVar3 = (long)i;
  if (i < (int)uVar4) {
    i = uVar4;
  }
  do {
    if (i == lVar3) {
      return i;
    }
    cVar5 = L'\xffff';
    if ((uint)lVar3 < uVar4) {
      pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
      if (((int)sVar1 & 2U) == 0) {
        pcVar6 = (pUVar2->fUnion).fFields.fArray;
      }
      cVar5 = pcVar6[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while ((((0xd < (ushort)cVar5) || ((0x3400U >> ((ushort)cVar5 & 0x1f) & 1) == 0)) &&
           (1 < (ushort)cVar5 - 0x2028)) && ((ushort)cVar5 != 0x85));
  return (int32_t)lVar3;
}

Assistant:

int32_t
CollationRuleParser::skipComment(int32_t i) const {
    // skip to past the newline
    while(i < rules->length()) {
        UChar c = rules->charAt(i++);
        // LF or FF or CR or NEL or LS or PS
        if(c == 0xa || c == 0xc || c == 0xd || c == 0x85 || c == 0x2028 || c == 0x2029) {
            // Unicode Newline Guidelines: "A readline function should stop at NLF, LS, FF, or PS."
            // NLF (new line function) = CR or LF or CR+LF or NEL.
            // No need to collect all of CR+LF because a following LF will be ignored anyway.
            break;
        }
    }
    return i;
}